

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_flow.cc
# Opt level: O0

void __thiscall
re2c::Node::naked_ways
          (Node *this,way_t *prefix,
          vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
          *ways,nakeds_t *size)

{
  bool bVar1;
  u32lim_t<1024U> y;
  u32lim_t<1024U> uVar2;
  size_type x;
  pointer ppVar3;
  byte local_71;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_68 [3];
  _Self local_50;
  _Self local_48;
  iterator i;
  local_inc _;
  nakeds_t *size_local;
  vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
  *ways_local;
  way_t *prefix_local;
  Node *this_local;
  
  bVar1 = rule_rank_t::is_none(&(this->rule).rank);
  if (bVar1) {
    bVar1 = end(this);
    if (bVar1) {
      std::
      vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
      ::push_back(ways,prefix);
      uVar2.value = size->value;
      x = std::
          vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
          ::size(prefix);
      y = u32lim_t<1024U>::from64(x);
      uVar2 = operator+(uVar2,y);
      size->value = uVar2.value;
    }
    else if (this->loop < 2) {
      local_increment_t<unsigned_char>::local_increment_t
                ((local_increment_t<unsigned_char> *)&i,&this->loop);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<re2c::Node_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>_>
           ::begin(&this->arcsets);
      while( true ) {
        local_50._M_node =
             (_Base_ptr)
             std::
             map<re2c::Node_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>_>
             ::end(&this->arcsets);
        bVar1 = std::operator!=(&local_48,&local_50);
        local_71 = 0;
        if (bVar1) {
          bVar1 = u32lim_t<1024U>::overflow(size);
          local_71 = bVar1 ^ 0xff;
        }
        if ((local_71 & 1) == 0) break;
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ::operator->(&local_48);
        local_68[0] = &ppVar3->second;
        std::
        vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
        ::push_back(prefix,local_68);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ::operator->(&local_48);
        naked_ways(ppVar3->first,prefix,ways,size);
        std::
        vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
        ::pop_back(prefix);
        std::
        _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ::operator++(&local_48);
      }
      local_increment_t<unsigned_char>::~local_increment_t((local_increment_t<unsigned_char> *)&i);
    }
  }
  return;
}

Assistant:

void Node::naked_ways (way_t & prefix, std::vector<way_t> & ways, nakeds_t &size)
{
	if (!rule.rank.is_none ())
	{
		return;
	}
	else if (end ())
	{
		ways.push_back (prefix);
		size = size + nakeds_t::from64(prefix.size ());
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcsets_t::iterator i = arcsets.begin ();
			i != arcsets.end () && !size.overflow (); ++i)
		{
			prefix.push_back (&i->second);
			i->first->naked_ways (prefix, ways, size);
			prefix.pop_back ();
		}
	}
}